

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O0

void __thiscall OctreeBuilder::create_pipeline(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  element_type *peVar1;
  Ptr<Device> *in_RDI;
  shared_ptr<myvk::ShaderModule> octree_modify_arg_shader_module;
  uint32_t kOctreeModifyArgCompSpv [307];
  shared_ptr<myvk::ShaderModule> octree_alloc_node_shader_module;
  uint32_t kOctreeAllocNodeCompSpv [406];
  shared_ptr<myvk::ShaderModule> octree_init_node_shader_module;
  uint32_t kOctreeInitNodeCompSpv [252];
  shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module;
  uint32_t kOctreeTagNodeCompSpv [856];
  VkSpecializationInfo spec_info;
  VkSpecializationMapEntry spec_entries [2];
  uint32_t spec_data [2];
  shared_ptr<myvk::ComputePipeline> *in_stack_ffffffffffffe178;
  shared_ptr<myvk::ComputePipeline> *in_stack_ffffffffffffe180;
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_ffffffffffffe190;
  allocator_type *in_stack_ffffffffffffe1a8;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_ffffffffffffe1b0;
  iterator in_stack_ffffffffffffe1b8;
  size_type in_stack_ffffffffffffe1c0;
  undefined8 **ppuVar2;
  uint32_t code_size;
  uint32_t *code;
  undefined1 local_1db8 [16];
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_ffffffffffffe258;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_ffffffffffffe260;
  Ptr<Device> *in_stack_ffffffffffffe268;
  VkSpecializationInfo *in_stack_ffffffffffffe288;
  Ptr<ShaderModule> *in_stack_ffffffffffffe290;
  Ptr<PipelineLayout> *in_stack_ffffffffffffe298;
  undefined1 local_18c8 [1664];
  undefined1 local_1248 [1040];
  undefined1 local_e38 [3424];
  undefined4 local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  uint32_t *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88 [11];
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> local_59;
  undefined1 *local_58 [2];
  undefined8 *local_48;
  undefined8 local_40;
  
  std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_ffffffffffffe180,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_ffffffffffffe178);
  local_40 = 1;
  local_48 = local_58;
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *)0x156274);
  __l._M_len = in_stack_ffffffffffffe1c0;
  __l._M_array = in_stack_ffffffffffffe1b8;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector(in_stack_ffffffffffffe1b0,__l,in_stack_ffffffffffffe1a8);
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  code = local_88;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)0x1562c7);
  myvk::PipelineLayout::Create
            (in_stack_ffffffffffffe268,in_stack_ffffffffffffe260,in_stack_ffffffffffffe258);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            ((shared_ptr<myvk::PipelineLayout> *)in_stack_ffffffffffffe180,
             (shared_ptr<myvk::PipelineLayout> *)in_stack_ffffffffffffe178);
  std::shared_ptr<myvk::PipelineLayout>::~shared_ptr((shared_ptr<myvk::PipelineLayout> *)0x156314);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~vector
            (in_stack_ffffffffffffe190);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)in_stack_ffffffffffffe190);
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::~allocator(&local_59);
  ppuVar2 = &local_48;
  do {
    ppuVar2 = ppuVar2 + -2;
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x15636a);
  } while (ppuVar2 != (undefined8 **)local_58);
  peVar1 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x15638e);
  code_size = (uint32_t)((ulong)ppuVar2 >> 0x20);
  local_90 = Voxelizer::GetVoxelResolution(peVar1);
  peVar1 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1563aa);
  local_8c = Voxelizer::GetVoxelFragmentCount(peVar1);
  local_a8 = 0x400000001;
  uStack_a0 = 4;
  local_b8 = 0;
  uStack_b0 = 4;
  local_d8 = 2;
  local_d0 = &local_b8;
  local_c8 = 8;
  local_c0 = &local_90;
  memcpy(local_e38,&DAT_003c1090,0xd60);
  myvk::ShaderModule::Create(in_RDI,code,code_size);
  myvk::ComputePipeline::Create
            (in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,in_stack_ffffffffffffe288);
  std::shared_ptr<myvk::ComputePipeline>::operator=
            (in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
  std::shared_ptr<myvk::ComputePipeline>::~shared_ptr((shared_ptr<myvk::ComputePipeline> *)0x1564a0)
  ;
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1564ad);
  memcpy(local_1248,&DAT_003c1df0,0x3f0);
  myvk::ShaderModule::Create(in_RDI,code,code_size);
  myvk::ComputePipeline::Create
            (in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,in_stack_ffffffffffffe288);
  std::shared_ptr<myvk::ComputePipeline>::operator=
            (in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
  std::shared_ptr<myvk::ComputePipeline>::~shared_ptr((shared_ptr<myvk::ComputePipeline> *)0x15653b)
  ;
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x156548);
  memcpy(local_18c8,&DAT_003c21e0,0x658);
  myvk::ShaderModule::Create(in_RDI,code,code_size);
  myvk::ComputePipeline::Create
            (in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,in_stack_ffffffffffffe288);
  std::shared_ptr<myvk::ComputePipeline>::operator=
            (in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
  std::shared_ptr<myvk::ComputePipeline>::~shared_ptr((shared_ptr<myvk::ComputePipeline> *)0x1565d6)
  ;
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1565e3);
  memcpy(local_1db8,&DAT_003c2840,0x4cc);
  myvk::ShaderModule::Create(in_RDI,code,code_size);
  myvk::ComputePipeline::Create
            (in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,in_stack_ffffffffffffe288);
  std::shared_ptr<myvk::ComputePipeline>::operator=
            (in_stack_ffffffffffffe180,in_stack_ffffffffffffe178);
  std::shared_ptr<myvk::ComputePipeline>::~shared_ptr((shared_ptr<myvk::ComputePipeline> *)0x15666f)
  ;
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x15667c);
  return;
}

Assistant:

void OctreeBuilder::create_pipeline(const std::shared_ptr<myvk::Device> &device) {
	m_pipeline_layout = myvk::PipelineLayout::Create(device, {m_descriptor_set_layout}, {});

	{
		uint32_t spec_data[] = {m_voxelizer_ptr->GetVoxelResolution(), m_voxelizer_ptr->GetVoxelFragmentCount()};
		VkSpecializationMapEntry spec_entries[] = {{0, 0, sizeof(uint32_t)}, {1, sizeof(uint32_t), sizeof(uint32_t)}};
		VkSpecializationInfo spec_info = {2, spec_entries, 2 * sizeof(uint32_t), spec_data};
		constexpr uint32_t kOctreeTagNodeCompSpv[] = {
#include "spirv/octree_tag_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_tag_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeTagNodeCompSpv, sizeof(kOctreeTagNodeCompSpv));
		m_tag_node_pipeline =
		    myvk::ComputePipeline::Create(m_pipeline_layout, octree_tag_node_shader_module, &spec_info);
	}

	{
		constexpr uint32_t kOctreeInitNodeCompSpv[] = {
#include "spirv/octree_init_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_init_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeInitNodeCompSpv, sizeof(kOctreeInitNodeCompSpv));
		m_init_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_init_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeAllocNodeCompSpv[] = {
#include "spirv/octree_alloc_node.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_alloc_node_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeAllocNodeCompSpv, sizeof(kOctreeAllocNodeCompSpv));
		m_alloc_node_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_alloc_node_shader_module);
	}

	{
		constexpr uint32_t kOctreeModifyArgCompSpv[] = {
#include "spirv/octree_modify_arg.comp.u32"
		};
		std::shared_ptr<myvk::ShaderModule> octree_modify_arg_shader_module =
		    myvk::ShaderModule::Create(device, kOctreeModifyArgCompSpv, sizeof(kOctreeModifyArgCompSpv));
		m_modify_arg_pipeline = myvk::ComputePipeline::Create(m_pipeline_layout, octree_modify_arg_shader_module);
	}
}